

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O1

int luaopen_debugchannel(lua_State *L)

{
  long lVar1;
  undefined **ppuVar2;
  luaL_Reg *plVar3;
  luaL_Reg l [5];
  luaL_Reg alStack_68 [5];
  
  ppuVar2 = &PTR_anon_var_dwarf_2066b_00162bb0;
  plVar3 = alStack_68;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    plVar3->name = *ppuVar2;
    ppuVar2 = ppuVar2 + 1;
    plVar3 = (luaL_Reg *)((long)plVar3 + 8);
  }
  luaL_checkversion_(L,503.0,0x88);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,4);
  luaL_setfuncs(L,alStack_68,0);
  return 1;
}

Assistant:

int
luaopen_debugchannel(lua_State *L) {
	luaL_Reg l[] = {
		{ "create", lcreate },	// for write
		{ "connect", lconnect },	// for read
		{ "release", lrelease },
		{ "sethook", db_sethook },
		{ NULL, NULL },
	};
	luaL_checkversion(L);
	luaL_newlib(L,l);
	return 1;
}